

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_lib.h
# Opt level: O3

void __thiscall iqnet::ssl::need_write::~need_write(need_write *this)

{
  exception::~exception((exception *)this);
  operator_delete(this,0x30);
  return;
}

Assistant:

class LIBIQXMLRPC_API need_write: public ssl::io_error {
public:
  need_write():
    io_error( SSL_ERROR_WANT_WRITE ) {}
};

class LIBIQXMLRPC_API need_read: public ssl::io_error {
public:
  need_read():
    io_error( SSL_ERROR_WANT_READ ) {}
};

} // namespace ssl
}